

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O1

char * anon_unknown.dwarf_799b06::Lookup
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                  *dummy_lh,char *key)

{
  iterator iVar1;
  char *pcVar2;
  allocator<char> local_31;
  key_type local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,key,&local_31);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
          ::find(&dummy_lh->_M_t,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar1._M_node == &(dummy_lh->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = *(char **)(iVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

static const char *Lookup(
    std::map<std::string, std::unique_ptr<char[]>> *dummy_lh, const char *key) {
  // Using operator[] implicitly inserts into the map.
  auto iter = dummy_lh->find(key);
  if (iter == dummy_lh->end()) {
    return nullptr;
  }
  return iter->second.get();
}